

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcPropertySet::~IfcPropertySet(IfcPropertySet *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  void *pvVar3;
  pointer pcVar4;
  undefined1 *puVar5;
  
  (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcPropertySet_009adf98;
  *(undefined ***)&this->field_0xd0 = &PTR__IfcPropertySet_009ae038;
  *(undefined ***)
   &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.field_0x88 =
       &PTR__IfcPropertySet_009adfc0;
  *(undefined ***)
   &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.field_0x98 =
       &PTR__IfcPropertySet_009adfe8;
  *(undefined ***)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.field_0xa8 =
       &PTR__IfcPropertySet_009ae010;
  pvVar3 = *(void **)&(this->super_IfcPropertySetDefinition).field_0xb8;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&this->field_0xc8 - (long)pvVar3);
  }
  (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x9ae228;
  *(undefined8 *)&this->field_0xd0 = 0x9ae250;
  pcVar4 = (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
           Description.ptr._M_dataplus._M_p;
  paVar1 = &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
            Description.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.Name.ptr
           ._M_dataplus._M_p;
  paVar1 = &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.Name.
            ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  puVar5 = *(undefined1 **)
            &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x10;
  puVar2 = &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x20;
  if (puVar5 != puVar2) {
    operator_delete(puVar5,*(long *)puVar2 + 1);
  }
  operator_delete(this,0xe8);
  return;
}

Assistant:

IfcPropertySet() : Object("IfcPropertySet") {}